

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getNode(LLVMDataDependenceAnalysis *this,Value *val)

{
  RWNode *pRVar1;
  
  pRVar1 = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getNode
                     (*(GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> **)
                       (this + 0xb0),val);
  return pRVar1;
}

Assistant:

RWNode *LLVMDataDependenceAnalysis::getNode(const llvm::Value *val) {
    return builder->getNode(val);
}